

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwSetWindowPos(GLFWwindow *handle,int xpos,int ypos)

{
  int iVar1;
  byte *pbVar2;
  _GLFWwindow *window;
  undefined1 auStack_b0 [92];
  int iStack_54;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/glfw/src/window.c"
                  ,0x20e,"void glfwSetWindowPos(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized != 0) {
    if (*(long *)(handle + 0x40) != 0) {
      return;
    }
    XGetWindowAttributes(_glfw.x11.display,*(undefined8 *)(handle + 0x340),auStack_b0);
    if (iStack_54 != 2) {
      pbVar2 = (byte *)XAllocSizeHints();
      iVar1 = XGetWMNormalHints(_glfw.x11.display,*(undefined8 *)(handle + 0x340),pbVar2,auStack_b0)
      ;
      if (iVar1 != 0) {
        *pbVar2 = *pbVar2 | 4;
        pbVar2[8] = 0;
        pbVar2[9] = 0;
        pbVar2[10] = 0;
        pbVar2[0xb] = 0;
        pbVar2[0xc] = 0;
        pbVar2[0xd] = 0;
        pbVar2[0xe] = 0;
        pbVar2[0xf] = 0;
        XSetWMNormalHints(_glfw.x11.display,*(undefined8 *)(handle + 0x340),pbVar2);
      }
      XFree(pbVar2);
    }
    XMoveWindow(_glfw.x11.display,*(undefined8 *)(handle + 0x340),xpos,ypos);
    XFlush(_glfw.x11.display);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowPos(GLFWwindow* handle, int xpos, int ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformSetWindowPos(window, xpos, ypos);
}